

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

char * llvm::itaniumDemangle(char *MangledName,char *Buf,size_t *N,int *Status)

{
  BlockMeta *pBVar1;
  BlockMeta *__ptr;
  int iVar2;
  size_t sVar3;
  Node *pNVar4;
  size_t sVar5;
  char *pcVar6;
  OutputStream S;
  Db Parser;
  OutputStream local_1358;
  undefined1 local_1338 [760];
  char acStack_1040 [4088];
  BlockMeta *local_48;
  
  if ((MangledName == (char *)0x0) || (N == (size_t *)0x0 && Buf != (char *)0x0)) {
    if (Status != (int *)0x0) {
      *Status = -3;
    }
    return (char *)0x0;
  }
  sVar3 = strlen(MangledName);
  local_1338._8_8_ = MangledName + sVar3;
  local_1338._16_8_ = local_1338 + 0x28;
  local_1338._32_8_ = local_1338 + 0x128;
  local_1338._296_8_ = local_1338 + 0x140;
  local_1338._312_8_ = local_1338 + 0x240;
  local_1338._576_8_ = local_1338 + 600;
  local_1338._592_8_ = local_1338 + 0x298;
  local_1338._664_8_ = local_1338 + 0x2b0;
  local_1338._680_8_ = local_1338 + 0x2d0;
  local_1338._720_8_ = (_func_void_void_ptr_char_ptr *)0x0;
  local_1338._728_8_ = (void *)0x0;
  local_1338[0x2e0] = true;
  local_1338[0x2e1] = false;
  local_1338[0x2e2] = false;
  pBVar1 = (BlockMeta *)(local_1338 + 0x2f0);
  local_1338[0x2f0] = '\0';
  local_1338[0x2f1] = '\0';
  local_1338[0x2f2] = '\0';
  local_1338[0x2f3] = '\0';
  local_1338[0x2f4] = '\0';
  local_1338[0x2f5] = '\0';
  local_1338[0x2f6] = '\0';
  local_1338[0x2f7] = '\0';
  acStack_1040[0] = '\0';
  acStack_1040[1] = '\0';
  acStack_1040[2] = '\0';
  acStack_1040[3] = '\0';
  acStack_1040[4] = '\0';
  acStack_1040[5] = '\0';
  acStack_1040[6] = '\0';
  acStack_1040[7] = '\0';
  local_1358.CurrentPackIndex = 0xffffffff;
  local_1358.CurrentPackMax = 0xffffffff;
  local_1338._0_8_ = MangledName;
  local_1338._24_8_ = local_1338._16_8_;
  local_1338._304_8_ = local_1338._296_8_;
  local_1338._584_8_ = local_1338._576_8_;
  local_1338._672_8_ = local_1338._664_8_;
  local_48 = pBVar1;
  pNVar4 = anon_unknown.dwarf_2dcf93::Db::parse((Db *)local_1338);
  if (pNVar4 == (Node *)0x0) {
    iVar2 = -2;
    pcVar6 = (char *)0x0;
  }
  else {
    if (Buf == (char *)0x0) {
      sVar5 = 0x400;
      Buf = (char *)malloc(0x400);
      if (Buf == (char *)0x0) {
        iVar2 = -1;
        pcVar6 = (char *)0x0;
        goto LAB_00187f92;
      }
    }
    else {
      sVar5 = *N;
    }
    local_1358.CurrentPosition = 0;
    local_1358.Buffer = Buf;
    local_1358.BufferCapacity = sVar5;
    if (local_1338._664_8_ != local_1338._672_8_) {
      __assert_fail("Parser.ForwardTemplateRefs.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                    ,0x1375,"char *llvm::itaniumDemangle(const char *, char *, size_t *, int *)");
    }
    (*pNVar4->_vptr_Node[4])(pNVar4,&local_1358);
    if (pNVar4->RHSComponentCache != No) {
      (*pNVar4->_vptr_Node[5])(pNVar4,&local_1358);
    }
    OutputStream::grow(&local_1358,1);
    local_1358.Buffer[local_1358.CurrentPosition] = '\0';
    if (N != (size_t *)0x0) {
      *N = local_1358.CurrentPosition + 1;
    }
    iVar2 = 0;
    pcVar6 = local_1358.Buffer;
    local_1358.CurrentPosition = local_1358.CurrentPosition + 1;
  }
LAB_00187f92:
  if (Status != (int *)0x0) {
    *Status = iVar2;
  }
  while (__ptr = local_48, __ptr != (BlockMeta *)0x0) {
    local_48 = __ptr->Next;
    if (__ptr != pBVar1) {
      free(__ptr);
    }
  }
  local_1338[0x2f0] = '\0';
  local_1338[0x2f1] = '\0';
  local_1338[0x2f2] = '\0';
  local_1338[0x2f3] = '\0';
  local_1338[0x2f4] = '\0';
  local_1338[0x2f5] = '\0';
  local_1338[0x2f6] = '\0';
  local_1338[0x2f7] = '\0';
  acStack_1040[0] = '\0';
  acStack_1040[1] = '\0';
  acStack_1040[2] = '\0';
  acStack_1040[3] = '\0';
  acStack_1040[4] = '\0';
  acStack_1040[5] = '\0';
  acStack_1040[6] = '\0';
  acStack_1040[7] = '\0';
  local_48 = pBVar1;
  if ((undefined1 *)local_1338._664_8_ != local_1338 + 0x2b0) {
    free((void *)local_1338._664_8_);
  }
  if ((undefined1 *)local_1338._576_8_ != local_1338 + 600) {
    free((void *)local_1338._576_8_);
  }
  if ((undefined1 *)local_1338._296_8_ != local_1338 + 0x140) {
    free((void *)local_1338._296_8_);
  }
  if ((undefined1 *)local_1338._16_8_ != local_1338 + 0x28) {
    free((void *)local_1338._16_8_);
  }
  return pcVar6;
}

Assistant:

char *llvm::itaniumDemangle(const char *MangledName, char *Buf,
                            size_t *N, int *Status) {
  if (MangledName == nullptr || (Buf != nullptr && N == nullptr)) {
    if (Status)
      *Status = demangle_invalid_args;
    return nullptr;
  }

  int InternalStatus = demangle_success;
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  OutputStream S;

  Node *AST = Parser.parse();

  if (AST == nullptr)
    InternalStatus = demangle_invalid_mangled_name;
  else if (initializeOutputStream(Buf, N, S, 1024))
    InternalStatus = demangle_memory_alloc_failure;
  else {
    assert(Parser.ForwardTemplateRefs.empty());
    AST->print(S);
    S += '\0';
    if (N != nullptr)
      *N = S.getCurrentPosition();
    Buf = S.getBuffer();
  }

  if (Status)
    *Status = InternalStatus;
  return InternalStatus == demangle_success ? Buf : nullptr;
}